

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEditPrivate::createAutoBulletList(QTextEditPrivate *this)

{
  QWidgetTextControl *in_RDI;
  long in_FS_OFFSET;
  QTextCursor cursor;
  QTextListFormat listFmt;
  QTextBlockFormat blockFmt;
  Style astyle;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 selectionClipboard;
  QTextBlockFormat *cursor_00;
  QWidgetTextControl *this_00;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  cursor_00 = (QTextBlockFormat *)&local_30;
  this_00 = in_RDI;
  QWidgetTextControl::textCursor
            ((QWidgetTextControl *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  astyle = (Style)((ulong)in_RDI >> 0x20);
  QTextCursor::beginEditBlock();
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  selectionClipboard = (undefined1)((ulong)&local_18 >> 0x38);
  QTextCursor::blockFormat();
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTextListFormat::QTextListFormat((QTextListFormat *)&local_28);
  QTextListFormat::setStyle
            ((QTextListFormat *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),astyle
            );
  QTextBlockFormat::indent((QTextBlockFormat *)0x6ceea8);
  QTextListFormat::setIndent
            ((QTextListFormat *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),astyle
            );
  QTextBlockFormat::setIndent((QTextBlockFormat *)(ulong)in_stack_ffffffffffffffa8,astyle);
  QTextCursor::setBlockFormat(cursor_00);
  QTextCursor::createList((QTextListFormat *)cursor_00);
  QTextCursor::endEditBlock();
  QWidgetTextControl::setTextCursor(this_00,(QTextCursor *)cursor_00,(bool)selectionClipboard);
  QTextListFormat::~QTextListFormat((QTextListFormat *)0x6cef12);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x6cef1c);
  QTextCursor::~QTextCursor((QTextCursor *)cursor_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::createAutoBulletList()
{
    QTextCursor cursor = control->textCursor();
    cursor.beginEditBlock();

    QTextBlockFormat blockFmt = cursor.blockFormat();

    QTextListFormat listFmt;
    listFmt.setStyle(QTextListFormat::ListDisc);
    listFmt.setIndent(blockFmt.indent() + 1);

    blockFmt.setIndent(0);
    cursor.setBlockFormat(blockFmt);

    cursor.createList(listFmt);

    cursor.endEditBlock();
    control->setTextCursor(cursor);
}